

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleSerialAnalyzer.cpp
# Opt level: O3

void __thiscall SimpleSerialAnalyzer::SimpleSerialAnalyzer(SimpleSerialAnalyzer *this)

{
  Analyzer2::Analyzer2(&this->super_Analyzer2);
  *(undefined ***)this = &PTR__SimpleSerialAnalyzer_00107ca0;
  SimpleSerialAnalyzerSettings::SimpleSerialAnalyzerSettings(&this->mSettings);
  (this->mResults)._M_t.
  super___uniq_ptr_impl<SimpleSerialAnalyzerResults,_std::default_delete<SimpleSerialAnalyzerResults>_>
  ._M_t.
  super__Tuple_impl<0UL,_SimpleSerialAnalyzerResults_*,_std::default_delete<SimpleSerialAnalyzerResults>_>
  .super__Head_base<0UL,_SimpleSerialAnalyzerResults_*,_false>._M_head_impl =
       (SimpleSerialAnalyzerResults *)0x0;
  SimpleSerialSimulationDataGenerator::SimpleSerialSimulationDataGenerator
            (&this->mSimulationDataGenerator);
  this->mSimulationInitilized = false;
  Analyzer::SetAnalyzerSettings((AnalyzerSettings *)this);
  return;
}

Assistant:

SimpleSerialAnalyzer::SimpleSerialAnalyzer()
:	Analyzer2(),  
	mSettings(),
	mSimulationInitilized( false )
{
	SetAnalyzerSettings( &mSettings );
}